

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QVariant * __thiscall QObject::property(QVariant *__return_storage_ptr__,QObject *this,char *name)

{
  QObjectData *pQVar1;
  QList<QByteArray> *vector;
  int iVar2;
  undefined4 extraout_var;
  qsizetype qVar3;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  undefined1 uVar4;
  QMetaProperty local_58;
  char *local_38;
  long local_30;
  QMetaObject *this_00;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  local_38 = name;
  iVar2 = (**this->_vptr_QObject)(this);
  this_00 = (QMetaObject *)CONCAT44(extraout_var,iVar2);
  uVar4 = this_00 != (QMetaObject *)0x0;
  if ((bool)uVar4 && name != (char *)0x0) {
    iVar2 = QMetaObject::indexOfProperty(this_00,name);
    if (-1 < iVar2) {
      local_58.menum.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.menum.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::property(&local_58,this_00,iVar2);
      QMetaProperty::read((QMetaProperty *)__return_storage_ptr__,(int)&local_58,this,
                          CONCAT71(in_register_00000009,uVar4));
      goto LAB_0028ecce;
    }
    vector = (QList<QByteArray> *)pQVar1[1]._vptr_QObjectData;
    if (vector != (QList<QByteArray> *)0x0) {
      qVar3 = QtPrivate::indexOf<QByteArray,char_const*>(vector,&local_38,0);
      QList<QVariant>::value
                (__return_storage_ptr__,(QList<QVariant> *)(pQVar1[1]._vptr_QObjectData + 3),
                 (long)(int)qVar3);
      goto LAB_0028ecce;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_0028ecce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QObject::property(const char *name) const
{
    Q_D(const QObject);
    const QMetaObject *meta = metaObject();
    if (!name || !meta)
        return QVariant();

    int id = meta->indexOfProperty(name);
    if (id < 0) {
        if (!d->extraData)
            return QVariant();
        const int i = d->extraData->propertyNames.indexOf(name);
        return d->extraData->propertyValues.value(i);
    }
    QMetaProperty p = meta->property(id);
#ifndef QT_NO_DEBUG
    if (!p.isReadable())
        qWarning("%s::property: Property \"%s\" invalid or does not exist",
                 metaObject()->className(), name);
#endif
    return p.read(this);
}